

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::File::close(File *this,int __fd)

{
  CStringRef message;
  int iVar1;
  undefined8 uVar2;
  int result;
  int in_stack_ffffffffffffffe4;
  BasicCStringRef<char> in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (this->fd_ != -1) {
    iVar1 = ::close(this->fd_);
    this->fd_ = -1;
    if (iVar1 != 0) {
      uVar2 = __cxa_allocate_exception(0x18);
      __errno_location();
      BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffffe8,"cannot close file");
      message.data_._4_4_ = iVar1;
      message.data_._0_4_ = in_stack_fffffffffffffff0;
      SystemError::SystemError
                ((SystemError *)in_stack_ffffffffffffffe8.data_,in_stack_ffffffffffffffe4,message);
      __cxa_throw(uVar2,&SystemError::typeinfo,SystemError::~SystemError);
    }
  }
  return (int)this;
}

Assistant:

void fmt::File::close() {
  if (fd_ == -1)
    return;
  // Don't retry close in case of EINTR!
  // See http://linux.derkeiler.com/Mailing-Lists/Kernel/2005-09/3000.html
  int result = FMT_POSIX_CALL(close(fd_));
  fd_ = -1;
  if (result != 0)
    FMT_THROW(SystemError(errno, "cannot close file"));
}